

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

pair<slang::bitmask<slang::ast::MethodFlags>,_slang::ast::Visibility>
slang::ast::getMethodFlags(TokenList *qualifiers,FunctionPrototypeSyntax *proto)

{
  ClassSpecifierSyntax *pCVar1;
  undefined8 uVar2;
  bool bVar3;
  reference pTVar4;
  reference ppCVar5;
  long in_RSI;
  undefined8 in_RDI;
  ClassSpecifierSyntax *specifier;
  iterator __end2_1;
  iterator __begin2_1;
  SyntaxList<slang::syntax::ClassSpecifierSyntax> *__range2_1;
  Token qual;
  iterator __end2;
  iterator __begin2;
  TokenList *__range2;
  Visibility visibility;
  bitmask<slang::ast::MethodFlags> flags;
  span<slang::parsing::Token,_18446744073709551615UL> *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff80;
  TokenKind in_stack_ffffffffffffff86;
  short in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff8a;
  __normal_iterator<slang::syntax::ClassSpecifierSyntax_**,_std::span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>_>
  local_60;
  long local_58;
  bitmask<slang::ast::MethodFlags> local_4e;
  bitmask<slang::ast::MethodFlags> local_4c;
  bitmask<slang::ast::MethodFlags> local_4a;
  undefined8 local_48;
  Info *pIStack_40;
  Token *local_38;
  __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
  local_30;
  undefined8 local_28;
  Visibility local_20;
  bitmask<slang::ast::MethodFlags> local_1a;
  long local_18;
  undefined8 local_10;
  pair<slang::bitmask<slang::ast::MethodFlags>,_slang::ast::Visibility> local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  bitmask<slang::ast::MethodFlags>::bitmask(&local_1a);
  local_20 = Public;
  local_28 = local_10;
  local_30._M_current =
       (Token *)std::span<slang::parsing::Token,_18446744073709551615UL>::begin
                          (in_stack_ffffffffffffff78);
  local_38 = (Token *)std::span<slang::parsing::Token,_18446744073709551615UL>::end
                                ((span<slang::parsing::Token,_18446744073709551615UL> *)
                                 CONCAT62(in_stack_ffffffffffffff8a,in_stack_ffffffffffffff88));
  while (bVar3 = __gnu_cxx::
                 operator==<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                           ((__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                             *)CONCAT26(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80),
                            (__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                             *)in_stack_ffffffffffffff78), ((bVar3 ^ 0xffU) & 1) != 0) {
    pTVar4 = __gnu_cxx::
             __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
             ::operator*(&local_30);
    uVar2._0_2_ = pTVar4->kind;
    uVar2._2_1_ = pTVar4->field_0x2;
    uVar2._3_1_ = pTVar4->numFlags;
    uVar2._4_4_ = pTVar4->rawLen;
    pIStack_40 = pTVar4->info;
    local_48 = uVar2;
    if (((short)uVar2 != 0x7d) && ((short)uVar2 != 0xa7)) {
      if ((short)uVar2 == 0xd1) {
        local_20 = Local;
      }
      else if ((short)uVar2 == 0xf1) {
        local_20 = Protected;
      }
      else if ((short)uVar2 == 0xf8) {
        bitmask<slang::ast::MethodFlags>::bitmask(&local_4c,Pure);
        bitmask<slang::ast::MethodFlags>::operator|=(&local_1a,&local_4c);
      }
      else if ((short)uVar2 != 0xf9) {
        if ((short)uVar2 == 0x11c) {
          bitmask<slang::ast::MethodFlags>::bitmask(&local_4a,Static);
          bitmask<slang::ast::MethodFlags>::operator|=(&local_1a,&local_4a);
        }
        else {
          bitmask<slang::ast::MethodFlags>::bitmask(&local_4e,Virtual);
          bitmask<slang::ast::MethodFlags>::operator|=(&local_1a,&local_4e);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
    ::operator++(&local_30);
    in_stack_ffffffffffffff88 = (short)uVar2;
  }
  local_58 = local_18 + 0x28;
  local_60._M_current =
       (ClassSpecifierSyntax **)
       std::span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL> *)
                  in_stack_ffffffffffffff78);
  std::span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>::end
            ((span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL> *)
             CONCAT62(in_stack_ffffffffffffff8a,in_stack_ffffffffffffff88));
  while (bVar3 = __gnu_cxx::
                 operator==<slang::syntax::ClassSpecifierSyntax_**,_std::span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>_>
                           ((__normal_iterator<slang::syntax::ClassSpecifierSyntax_**,_std::span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>_>
                             *)CONCAT26(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80),
                            (__normal_iterator<slang::syntax::ClassSpecifierSyntax_**,_std::span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>_>
                             *)in_stack_ffffffffffffff78), ((bVar3 ^ 0xffU) & 1) != 0) {
    ppCVar5 = __gnu_cxx::
              __normal_iterator<slang::syntax::ClassSpecifierSyntax_**,_std::span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_60);
    pCVar1 = *ppCVar5;
    bVar3 = parsing::Token::isMissing(&pCVar1->keyword);
    if (!bVar3) {
      in_stack_ffffffffffffff86 = (pCVar1->keyword).kind;
      if (in_stack_ffffffffffffff86 == ExtendsKeyword) {
        bitmask<slang::ast::MethodFlags>::bitmask
                  ((bitmask<slang::ast::MethodFlags> *)&stack0xffffffffffffff8c,Extends);
        bitmask<slang::ast::MethodFlags>::operator|=
                  (&local_1a,(bitmask<slang::ast::MethodFlags> *)&stack0xffffffffffffff8c);
      }
      else if (in_stack_ffffffffffffff86 == FinalKeyword) {
        bitmask<slang::ast::MethodFlags>::bitmask
                  ((bitmask<slang::ast::MethodFlags> *)&stack0xffffffffffffff8a,Final);
        bitmask<slang::ast::MethodFlags>::operator|=
                  (&local_1a,(bitmask<slang::ast::MethodFlags> *)&stack0xffffffffffffff8a);
      }
      else {
        bitmask<slang::ast::MethodFlags>::bitmask
                  ((bitmask<slang::ast::MethodFlags> *)&stack0xffffffffffffff8e,Initial);
        bitmask<slang::ast::MethodFlags>::operator|=
                  (&local_1a,(bitmask<slang::ast::MethodFlags> *)&stack0xffffffffffffff8e);
      }
    }
    __gnu_cxx::
    __normal_iterator<slang::syntax::ClassSpecifierSyntax_**,_std::span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_60);
  }
  std::pair<slang::bitmask<slang::ast::MethodFlags>,_slang::ast::Visibility>::
  pair<slang::bitmask<slang::ast::MethodFlags>_&,_slang::ast::Visibility_&,_true>
            (&local_8,&local_1a,&local_20);
  return local_8;
}

Assistant:

static std::pair<bitmask<MethodFlags>, Visibility> getMethodFlags(
    const TokenList& qualifiers, const FunctionPrototypeSyntax& proto) {

    bitmask<MethodFlags> flags;
    auto visibility = Visibility::Public;
    for (Token qual : qualifiers) {
        switch (qual.kind) {
            case TokenKind::LocalKeyword:
                visibility = Visibility::Local;
                break;
            case TokenKind::ProtectedKeyword:
                visibility = Visibility::Protected;
                break;
            case TokenKind::StaticKeyword:
                flags |= MethodFlags::Static;
                break;
            case TokenKind::PureKeyword:
                flags |= MethodFlags::Pure;
                break;
            case TokenKind::VirtualKeyword:
                flags |= MethodFlags::Virtual;
                break;
            case TokenKind::ConstKeyword:
            case TokenKind::ExternKeyword:
            case TokenKind::RandKeyword:
                // Parser already issued errors for these, so just ignore them here.
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    for (auto specifier : proto.specifiers) {
        if (!specifier->keyword.isMissing()) {
            switch (specifier->keyword.kind) {
                case TokenKind::InitialKeyword:
                    flags |= MethodFlags::Initial;
                    break;
                case TokenKind::ExtendsKeyword:
                    flags |= MethodFlags::Extends;
                    break;
                case TokenKind::FinalKeyword:
                    flags |= MethodFlags::Final;
                    break;
                default:
                    SLANG_UNREACHABLE;
            }
        }
    }

    return {flags, visibility};
}